

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::init
          (HelperInvocationDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  ostringstream *this_01;
  RenderContext *renderCtx;
  RenderContext *renderCtx_00;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
  data_00;
  int iVar1;
  undefined4 extraout_var;
  ShaderProgram *pSVar2;
  ProgramSources *pPVar3;
  FboHelper *this_02;
  TestError *this_03;
  int in_ECX;
  deUint32 pname;
  deUint32 in_R8D;
  int in_R9D;
  FboHelper *in_stack_fffffffffffffd48;
  string funcSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  undefined1 local_200 [40];
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [176];
  pointer local_100;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  
  pname = (deUint32)ctx;
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  iVar1 = getInteger((Functions *)CONCAT44(extraout_var,iVar1),pname);
  if (this->m_numSamples != -1) {
    iVar1 = this->m_numSamples;
  }
  if (this->m_checkAbsoluteValue == true) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   "abs(",&this->m_derivateFunc);
    std::operator+(&funcSource,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   "(value))");
    std::__cxx11::string::~string((string *)local_1b0);
  }
  else {
    std::operator+(&funcSource,&this->m_derivateFunc,"(value)");
  }
  pSVar2 = (ShaderProgram *)operator_new(0xd0);
  renderCtx_00 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100 = (pointer)0x0;
  uStack_f8 = 0;
  uStack_f7 = 0;
  uStack_f0 = 0;
  uStack_ef = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,
             "#version 310 es\nin highp vec2 a_position;\nuniform highp float u_pointSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tgl_PointSize = u_pointSize;\n}\n"
             ,(allocator<char> *)&stack0xfffffffffffffd4f);
  glu::VertexSource::VertexSource((VertexSource *)local_1d8,&local_220);
  pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_1b0,(ShaderSource *)local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "#version 310 es\nout mediump vec4 o_color;\nvoid main (void)\n{\n\thighp float value\t\t= gl_HelperInvocation ? 1.0 : 0.0;\n\thighp float derivate\t= "
             ,(allocator<char> *)&stack0xfffffffffffffd4e);
  std::operator+(&local_260,&local_280,&funcSource);
  std::operator+(&local_240,&local_260,
                 ";\n\tif (gl_HelperInvocation)\n\t\to_color = vec4(1.0, 0.0, derivate, 1.0);\n\telse\n\t\to_color = vec4(0.0, 1.0, derivate, 1.0);\n}\n"
                );
  glu::FragmentSource::FragmentSource((FragmentSource *)local_200,&local_240);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_200);
  glu::ShaderProgram::ShaderProgram(pSVar2,renderCtx_00,pPVar3);
  pSVar2 = (ShaderProgram *)0x0;
  this_00 = &this->m_program;
  data._8_8_ = 0;
  data.ptr = (ShaderProgram *)in_stack_fffffffffffffd48;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
            (&this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
             ,data);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniqueBase
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
             &stack0xfffffffffffffd50);
  std::__cxx11::string::~string((string *)(local_200 + 8));
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)&local_220);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                  m_data.ptr);
  if ((((this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
        m_data.ptr)->m_program).m_info.linkOk != false) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_01 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"Using GL_RGBA8 framebuffer with ");
    std::ostream::operator<<(this_01,iVar1);
    std::operator<<((ostream *)this_01," samples");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    this_02 = (FboHelper *)operator_new(0x78);
    FboHelper::FboHelper(this_02,renderCtx,iVar1,in_ECX,in_R8D,in_R9D);
    local_1b0._0_8_ = (pointer)0x0;
    data_00._8_8_ = pSVar2;
    data_00.ptr = in_stack_fffffffffffffd48;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::operator=(&this->m_fbo,data_00);
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
    ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
             *)local_1b0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    iVar1 = std::__cxx11::string::~string((string *)&funcSource);
    return iVar1;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
            );
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_03,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
             ,0x20d);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void HelperInvocationDerivateCase::init (void)
{
	const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
	const glw::Functions&		gl				= renderCtx.getFunctions();
	const int					maxSamples		= getInteger(gl, GL_MAX_SAMPLES);
	const int					actualSamples	= m_numSamples == NUM_SAMPLES_MAX ? maxSamples : m_numSamples;
	const std::string			funcSource		= (m_checkAbsoluteValue) ? ("abs(" + m_derivateFunc + "(value))") : (m_derivateFunc + "(value)");

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(m_context.getRenderContext(),
		glu::ProgramSources()
			<< glu::VertexSource(
				"#version 310 es\n"
				"in highp vec2 a_position;\n"
				"uniform highp float u_pointSize;\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
				"	gl_PointSize = u_pointSize;\n"
				"}\n")
			<< glu::FragmentSource(string(
				"#version 310 es\n"
				"out mediump vec4 o_color;\n"
				"void main (void)\n"
				"{\n"
				"	highp float value		= gl_HelperInvocation ? 1.0 : 0.0;\n"
				"	highp float derivate	= ") + funcSource + ";\n"
				"	if (gl_HelperInvocation)\n"
				"		o_color = vec4(1.0, 0.0, derivate, 1.0);\n"
				"	else\n"
				"		o_color = vec4(0.0, 1.0, derivate, 1.0);\n"
				"}\n")));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		m_program.clear();
		TCU_FAIL("Compile failed");
	}

	m_testCtx.getLog() << TestLog::Message << "Using GL_RGBA8 framebuffer with "
					   << actualSamples << " samples" << TestLog::EndMessage;

	m_fbo = MovePtr<FboHelper>(new FboHelper(renderCtx, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT,
											 FRAMEBUFFER_FORMAT, actualSamples));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}